

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vreg_assignment.cpp
# Opt level: O0

int __thiscall mocker::VRegAssignment::init(VRegAssignment *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  BasicBlockList *pBVar2;
  element_type *this_00;
  string *__rhs;
  undefined7 extraout_var;
  reference pBVar3;
  InstList *pIVar4;
  element_type *peVar5;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  *this_01;
  mapped_type *pmVar6;
  shared_ptr<mocker::ir::Reg> *psVar7;
  mapped_type *pmVar8;
  undefined1 local_150 [8];
  shared_ptr<mocker::ir::Reg> reg;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *option;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  *__range3;
  shared_ptr<mocker::ir::Phi> phi;
  shared_ptr<mocker::ir::IRInst> *inst_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  InstList *__range2_1;
  BasicBlock *bb_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  BasicBlockList *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [24];
  undefined1 local_68 [8];
  shared_ptr<mocker::ir::Reg> dest;
  shared_ptr<mocker::ir::IRInst> *inst;
  const_iterator __end2;
  const_iterator __begin2;
  InstList *__range2;
  BasicBlock *bb;
  const_iterator __end1;
  const_iterator __begin1;
  BasicBlockList *__range1;
  FunctionModule *func_local;
  VRegAssignment *this_local;
  
  pBVar2 = ir::FunctionModule::getBBs_abi_cxx11_((FunctionModule *)ctx);
  __end1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
           begin(pBVar2);
  bb = (BasicBlock *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (pBVar2);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&bb), bVar1) {
    pBVar3 = std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end1);
    pIVar4 = ir::BasicBlock::getInsts_abi_cxx11_(pBVar3);
    __end2 = std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::begin(pIVar4);
    inst = (shared_ptr<mocker::ir::IRInst> *)
           std::__cxx11::
           list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ::end(pIVar4);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&inst), bVar1) {
      dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end2);
      ir::getDest((ir *)local_68,
                  (shared_ptr<mocker::ir::IRInst> *)
                  dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
      if (bVar1) {
        this_00 = std::
                  __shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_68);
        __rhs = ir::Reg::getIdentifier_abi_cxx11_(this_00);
        std::operator+(&local_c0,"vir_",__rhs);
        std::operator+(&local_a0,&local_c0,"_");
        std::make_shared<mocker::nasm::Register,std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
        pmVar6 = std::
                 unordered_map<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
                 ::operator[](&this->mp,(key_type *)local_68);
        std::shared_ptr<mocker::nasm::Register>::operator=
                  (pmVar6,(shared_ptr<mocker::nasm::Register> *)local_80);
        std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Register> *)local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        local_80._20_4_ = 0;
      }
      else {
        local_80._20_4_ = 5;
      }
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_68);
      std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end2);
    }
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end1);
  }
  pBVar2 = ir::FunctionModule::getBBs_abi_cxx11_((FunctionModule *)ctx);
  __end1_1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
             begin(pBVar2);
  bb_1 = (BasicBlock *)
         std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                   (pBVar2);
  do {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&bb_1);
    if (!bVar1) {
      return (int)CONCAT71(extraout_var,bVar1);
    }
    pBVar3 = std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end1_1);
    pIVar4 = ir::BasicBlock::getInsts_abi_cxx11_(pBVar3);
    __end2_1 = std::__cxx11::
               list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
               ::begin(pIVar4);
    inst_1 = (shared_ptr<mocker::ir::IRInst> *)
             std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::end(pIVar4);
    while (bVar1 = std::operator!=(&__end2_1,(_Self *)&inst_1), bVar1) {
      phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end2_1);
      ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&__range3,
                 (shared_ptr<mocker::ir::IRInst> *)
                 phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&__range3);
      if (bVar1) {
        peVar5 = std::__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&__range3);
        this_01 = ir::Phi::getOptions(peVar5);
        __end3 = std::
                 vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                 ::begin(this_01);
        option = (pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *)
                 std::
                 vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                 ::end(this_01);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
                                           *)&option), bVar1) {
          reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               __gnu_cxx::
               __normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
               ::operator*(&__end3);
          ir::dycLocalReg((ir *)local_150,
                          (shared_ptr<mocker::ir::Addr> *)
                          reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi);
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_150);
          if (!bVar1) {
            __assert_fail("reg",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/vreg_assignment.cpp"
                          ,0x1c,"void mocker::VRegAssignment::init(const ir::FunctionModule &)");
          }
          pmVar6 = std::
                   unordered_map<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
                   ::operator[](&this->mp,(key_type *)local_150);
          peVar5 = std::
                   __shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&__range3);
          psVar7 = ir::Definition::getDest(&peVar5->super_Definition);
          pmVar8 = std::
                   unordered_map<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
                   ::operator[](&this->mp,psVar7);
          bVar1 = std::operator!=(pmVar6,pmVar8);
          if (bVar1) {
            peVar5 = std::
                     __shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&__range3);
            psVar7 = ir::Definition::getDest(&peVar5->super_Definition);
            pmVar6 = std::
                     unordered_map<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
                     ::operator[](&this->mp,psVar7);
            pmVar8 = std::
                     unordered_map<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>_>
                     ::operator[](&this->mp,(key_type *)local_150);
            std::shared_ptr<mocker::nasm::Register>::operator=(pmVar8,pmVar6);
          }
          std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_150);
          __gnu_cxx::
          __normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
          ::operator++(&__end3);
        }
        local_80._20_4_ = 0;
      }
      else {
        local_80._20_4_ = 9;
      }
      std::shared_ptr<mocker::ir::Phi>::~shared_ptr((shared_ptr<mocker::ir::Phi> *)&__range3);
      std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end2_1);
    }
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end1_1);
  } while( true );
}

Assistant:

void VRegAssignment::init(const ir::FunctionModule &func) {
  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto dest = ir::getDest(inst);
      if (!dest)
        continue;
      mp[dest] = std::make_shared<nasm::Register>("vir_" +
          dest->getIdentifier() + "_");
    }
  }

  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto phi = ir::dyc<ir::Phi>(inst);
      if (!phi)
        continue;

      for (auto &option : phi->getOptions()) {
        auto reg = ir::dycLocalReg(option.first);
        assert(reg);
        if (mp[reg] != mp[phi->getDest()]) {
          mp[reg] = mp[phi->getDest()];
        }
      }
    }
  }
}